

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockencodings.cpp
# Opt level: O0

bool __thiscall PartiallyDownloadedBlock::IsTxAvailable(PartiallyDownloadedBlock *this,size_t index)

{
  long lVar1;
  bool bVar2;
  nullptr_t pvVar3;
  nullptr_t in_RSI;
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  *in_RDI;
  long in_FS_OFFSET;
  undefined7 in_stack_ffffffffffffffc8;
  undefined1 in_stack_ffffffffffffffcf;
  bool local_9;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = CBlockHeader::IsNull
                    ((CBlockHeader *)CONCAT17(in_stack_ffffffffffffffcf,in_stack_ffffffffffffffc8));
  if (bVar2) {
    local_9 = false;
  }
  else {
    pvVar3 = (nullptr_t)
             std::
             vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
             ::size((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                     *)CONCAT17(in_stack_ffffffffffffffcf,in_stack_ffffffffffffffc8));
    if (pvVar3 <= in_RSI) {
      __assert_fail("index < txn_available.size()",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/blockencodings.cpp"
                    ,0xb3,"bool PartiallyDownloadedBlock::IsTxAvailable(size_t) const");
    }
    std::
    vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
    ::operator[](in_RDI,(size_type)in_RSI);
    bVar2 = std::operator==((shared_ptr<const_CTransaction> *)in_RDI,in_RSI);
    local_9 = (bool)((bVar2 ^ 0xffU) & 1);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return local_9;
  }
  __stack_chk_fail();
}

Assistant:

bool PartiallyDownloadedBlock::IsTxAvailable(size_t index) const
{
    if (header.IsNull()) return false;

    assert(index < txn_available.size());
    return txn_available[index] != nullptr;
}